

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O2

ResizeResult __thiscall
adios2::format::BPBase::ResizeBuffer(BPBase *this,size_t dataIn,string *hint)

{
  size_t sVar1;
  ResizeResult RVar2;
  ulong requiredSize;
  ulong currentSize;
  ulong __val;
  allocator local_1fb;
  allocator local_1fa;
  allocator local_1f9;
  string *local_1f8;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_1f8 = hint;
  std::__cxx11::string::string((string *)&local_50,"buffering",(allocator *)&local_1f0);
  profiling::IOChrono::Start(&this->m_Profiler,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  currentSize = (long)(this->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_Data).m_Buffer.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  __val = (this->m_Parameters).MaxBufferSize;
  requiredSize = (this->m_Data).super_Buffer.m_Position + dataIn;
  if (__val < dataIn) {
    std::__cxx11::string::string((string *)&local_1f0,"Toolkit",&local_1f9);
    std::__cxx11::string::string((string *)&local_1d0,"format::bp::BPBase",&local_1fa);
    std::__cxx11::string::string((string *)&local_1b0,"ResizeBuffer",&local_1fb);
    std::__cxx11::to_string(&local_f0,(double)dataIn * 9.5367431640625e-07);
    std::operator+(&local_d0,"data size: ",&local_f0);
    std::operator+(&local_b0,&local_d0," Mb is too large for adios2 bp MaxBufferSize=");
    std::__cxx11::to_string(&local_110,(double)__val * 9.5367431640625e-07);
    std::operator+(&local_90,&local_b0,&local_110);
    std::operator+(&local_70,&local_90,
                   "Mb, try increasing MaxBufferSize in call to IO SetParameters ");
    std::operator+(&local_190,&local_70,local_1f8);
    helper::Throw<std::runtime_error>(&local_1f0,&local_1d0,&local_1b0,&local_190,-1);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if (currentSize < requiredSize) {
    if (__val < requiredSize) {
      RVar2 = Flush;
      if (currentSize < __val) {
        std::__cxx11::to_string(&local_190,__val);
        std::operator+(&local_1b0," when resizing buffer to ",&local_190);
        std::operator+(&local_1d0,&local_1b0,"bytes, ");
        std::operator+(&local_1f0,&local_1d0,local_1f8);
        std::operator+(&local_130,&local_1f0,"\n");
        BufferSTL::Resize(&this->m_Data,__val,&local_130);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_1f0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_190);
      }
    }
    else {
      sVar1 = helper::NextExponentialSize
                        (requiredSize,currentSize,(this->m_Parameters).GrowthFactor);
      if (sVar1 < __val) {
        __val = sVar1;
      }
      std::__cxx11::to_string(&local_1b0,__val);
      std::operator+(&local_1d0," when resizing buffer to ",&local_1b0);
      std::operator+(&local_1f0,&local_1d0,"bytes, ");
      std::operator+(&local_150,&local_1f0,local_1f8);
      BufferSTL::Resize(&this->m_Data,__val,&local_150);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_1f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1b0);
      RVar2 = Success;
    }
  }
  else {
    RVar2 = Unchanged;
  }
  std::__cxx11::string::string((string *)&local_170,"buffering",(allocator *)&local_1f0);
  profiling::IOChrono::Stop(&this->m_Profiler,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  return RVar2;
}

Assistant:

BPBase::ResizeResult BPBase::ResizeBuffer(const size_t dataIn, const std::string hint)
{
    m_Profiler.Start("buffering");
    const size_t currentSize = m_Data.m_Buffer.size();
    const size_t requiredSize = dataIn + m_Data.m_Position;
    const size_t maxBufferSize = m_Parameters.MaxBufferSize;

    ResizeResult result = ResizeResult::Unchanged;

    if (dataIn > maxBufferSize)
    {
        helper::Throw<std::runtime_error>(
            "Toolkit", "format::bp::BPBase", "ResizeBuffer",
            "data size: " + std::to_string(static_cast<float>(dataIn) / (1024. * 1024.)) +
                " Mb is too large for adios2 bp MaxBufferSize=" +
                std::to_string(static_cast<float>(maxBufferSize) / (1024. * 1024.)) +
                "Mb, try increasing MaxBufferSize in call to IO "
                "SetParameters " +
                hint);
    }

    if (requiredSize <= currentSize)
    {
        // do nothing, unchanged is default
    }
    else if (requiredSize > maxBufferSize)
    {
        if (currentSize < maxBufferSize)
        {
            m_Data.Resize(maxBufferSize, " when resizing buffer to " +
                                             std::to_string(maxBufferSize) + "bytes, " + hint +
                                             "\n");
        }
        result = ResizeResult::Flush;
    }
    else // buffer must grow
    {
        if (currentSize < maxBufferSize)
        {
            const float growthFactor = m_Parameters.GrowthFactor;
            const size_t nextSize =
                std::min(maxBufferSize,
                         helper::NextExponentialSize(requiredSize, currentSize, growthFactor));
            m_Data.Resize(nextSize, " when resizing buffer to " + std::to_string(nextSize) +
                                        "bytes, " + hint);
            result = ResizeResult::Success;
        }
    }

    m_Profiler.Stop("buffering");
    return result;
}